

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TokenType TVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  AlphaNum *in_R8;
  _Alloc_hider _Var9;
  string text;
  string local_e0;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  iVar6 = this->recursion_limit_;
  this->recursion_limit_ = iVar6 + -1;
  if (iVar6 < 1) {
    local_e0._M_dataplus._M_p =
         "Message is too deep, the parser exceeded the configured recursion limit of ";
    local_e0._M_string_length = 0x4b;
    pcVar1 = local_b0.digits;
    local_b0.piece_data_ = pcVar1;
    pcVar7 = FastInt32ToBufferLeft(this->initial_recursion_limit_,pcVar1);
    local_b0.piece_size_ = (long)pcVar7 - (long)pcVar1;
    local_60.piece_data_ = ".";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_e0,&local_b0,&local_60,in_R8);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_003b4e2b:
      operator_delete(local_80._M_dataplus._M_p);
    }
LAB_003b4e30:
    bVar5 = false;
  }
  else {
    this_00 = &this->tokenizer_;
    if ((this->tokenizer_).current_.type == TYPE_STRING) {
      do {
        io::Tokenizer::Next(this_00);
      } while ((this_00->current_).type == TYPE_STRING);
    }
    else {
      paVar2 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"[","");
      bVar5 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (bVar5) {
        do {
          local_e0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"{","");
          _Var9._M_p = local_e0._M_dataplus._M_p;
          sVar8 = (this->tokenizer_).current_.text._M_string_length;
          if ((sVar8 == local_e0._M_string_length) &&
             ((sVar8 == 0 ||
              (iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                            local_e0._M_dataplus._M_p,sVar8), iVar6 == 0)))) {
            bVar5 = false;
          }
          else {
            local_b0.piece_data_ = local_b0.digits;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"<","");
            pcVar1 = local_b0.piece_data_;
            sVar8 = (this->tokenizer_).current_.text._M_string_length;
            if (sVar8 == local_b0.piece_size_) {
              if (sVar8 == 0) {
                bVar5 = false;
              }
              else {
                iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_b0.piece_data_,
                             sVar8);
                bVar5 = iVar6 != 0;
              }
            }
            else {
              bVar5 = true;
            }
            _Var9._M_p = local_e0._M_dataplus._M_p;
            if (pcVar1 != local_b0.digits) {
              operator_delete(pcVar1);
              _Var9._M_p = local_e0._M_dataplus._M_p;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var9._M_p != paVar2) {
            operator_delete(_Var9._M_p);
          }
          if (bVar5) {
            bVar5 = SkipFieldValue(this);
          }
          else {
            bVar5 = SkipFieldMessage(this);
          }
          if (bVar5 == false) break;
          local_e0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
          bVar5 = TryConsume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if (bVar5) goto LAB_003b502d;
          local_e0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,",","");
          bVar5 = Consume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        } while (bVar5);
        goto LAB_003b4e30;
      }
      local_e0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"-","");
      bVar5 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      TVar3 = (this_00->current_).type;
      if (1 < TVar3 - TYPE_INTEGER) {
        if (TVar3 != TYPE_IDENTIFIER) {
          pcVar4 = (this->tokenizer_).current_.text._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar4,
                     pcVar4 + (this->tokenizer_).current_.text._M_string_length);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,"Cannot skip field value, unexpected token: ",&local_e0);
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)&local_b0);
LAB_003b5157:
          if (local_b0.piece_data_ != local_b0.digits) {
            operator_delete(local_b0.piece_data_);
          }
          this->recursion_limit_ = this->recursion_limit_ + 1;
          local_80._M_dataplus._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) goto LAB_003b4e2b;
          goto LAB_003b4e30;
        }
        if (bVar5) {
          pcVar4 = (this->tokenizer_).current_.text._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar4,
                     pcVar4 + (this->tokenizer_).current_.text._M_string_length);
          if (local_e0._M_string_length != 0) {
            sVar8 = 0;
            do {
              if ((byte)(local_e0._M_dataplus._M_p[sVar8] + 0xbfU) < 0x1a) {
                local_e0._M_dataplus._M_p[sVar8] = local_e0._M_dataplus._M_p[sVar8] | 0x20;
              }
              sVar8 = sVar8 + 1;
            } while (local_e0._M_string_length != sVar8);
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_e0);
          if (((iVar6 != 0) &&
              (iVar6 = std::__cxx11::string::compare((char *)&local_e0), iVar6 != 0)) &&
             (iVar6 = std::__cxx11::string::compare((char *)&local_e0), iVar6 != 0)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0,"Invalid float number: ",&local_e0);
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)&local_b0);
            goto LAB_003b5157;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        }
      }
      io::Tokenizer::Next(this_00);
    }
LAB_003b502d:
    this->recursion_limit_ = this->recursion_limit_ + 1;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      while (true) {
        if (!LookingAt("{") && !LookingAt("<")) {
          DO(SkipFieldValue());
        } else {
          DO(SkipFieldMessage());
        }
        if (TryConsume("]")) {
          break;
        }
        DO(Consume(","));
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError("Cannot skip field value, unexpected token: " + text);
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      LowerString(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError("Invalid float number: " + text);
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }